

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O0

uint32_t helper_neon_qrdmlah_s32_arm(CPUARMState *env,int32_t src1,int32_t src2,int32_t src3)

{
  int iVar1;
  long local_28;
  int64_t ret;
  int32_t src3_local;
  int32_t src2_local;
  int32_t src1_local;
  CPUARMState *env_local;
  
  local_28 = (long)src3 * 0x80000000 + (long)src1 * (long)src2 + 0x40000000 >> 0x1f;
  if (local_28 != (int)local_28) {
    (env->vfp).qc[0] = 1;
    iVar1 = 0x7fffffff;
    if (local_28 < 0) {
      iVar1 = -0x80000000;
    }
    local_28 = (long)iVar1;
  }
  return (uint32_t)local_28;
}

Assistant:

uint32_t HELPER(neon_qrdmlah_s32)(CPUARMState *env, int32_t src1,
                                  int32_t src2, int32_t src3)
{
    /* Simplify similarly to int_qrdmlah_s16 above.  */
    int64_t ret = (int64_t)src1 * src2;
    ret = ((int64_t)src3 << 31) + ret + (1 << 30);
    ret >>= 31;
    if (ret != (int32_t)ret) {
        SET_QC();
        ret = (ret < 0 ? INT32_MIN : INT32_MAX);
    }
    return ret;
}